

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::get_hash_for_render_pass
          (StateRecorder *this,VkRenderPass render_pass,Hash *hash)

{
  VkRenderPass pVVar1;
  bool bVar2;
  iterator iVar3;
  long *in_FS_OFFSET;
  VkRenderPass render_pass_local;
  
  if (render_pass == (VkRenderPass)0x0) {
    *hash = 0;
  }
  else {
    render_pass_local = render_pass;
    iVar3 = std::
            _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_unsigned_long>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->impl->render_pass_to_hash)._M_h,&render_pass_local);
    pVVar1 = render_pass_local;
    if (iVar3.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar2 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                         ,"Render pass",render_pass_local);
      if (bVar2) {
        return false;
      }
      fprintf(_stderr,
              "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
              ,"Render pass",pVVar1);
      return false;
    }
    *hash = *(Hash *)((long)iVar3.
                            super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>
                            ._M_cur + 0x10);
  }
  return true;
}

Assistant:

bool StateRecorder::get_hash_for_render_pass(VkRenderPass render_pass, Hash *hash) const
{
	if (render_pass == VK_NULL_HANDLE)
	{
		// Dynamic rendering.
		*hash = 0;
		return true;
	}

	auto itr = impl->render_pass_to_hash.find(render_pass);
	if (itr == end(impl->render_pass_to_hash))
	{
		log_failed_hash("Render pass", render_pass);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}